

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void DC8uvNoLeft_C(uint8_t *dst)

{
  uint uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  ulong uVar7;
  uint5 uVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  long lVar11;
  
  uVar1 = *(uint *)(dst + -0x20);
  auVar3[0xc] = (char)(uVar1 >> 0x18);
  auVar3._0_12_ = ZEXT712(0);
  uVar8 = CONCAT32(auVar3._10_3_,(ushort)(byte)(uVar1 >> 0x10));
  auVar10._5_8_ = 0;
  auVar10._0_5_ = uVar8;
  uVar2 = *(undefined4 *)(dst + -0x1c);
  uVar7 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar7;
  auVar4[0xc] = (char)((uint)uVar2 >> 0x18);
  auVar5[8] = (char)((uint)uVar2 >> 0x10);
  auVar5._0_8_ = uVar7;
  auVar5[9] = 0;
  auVar5._10_3_ = auVar4._10_3_;
  auVar9._5_8_ = 0;
  auVar9._0_5_ = auVar5._8_5_;
  auVar6[4] = (char)((uint)uVar2 >> 8);
  auVar6._0_4_ = (int)uVar7;
  auVar6[5] = 0;
  auVar6._6_7_ = SUB137(auVar9 << 0x40,6);
  lVar11 = 0;
  do {
    *(ulong *)(dst + lVar11) =
         (ulong)((uint)(uint3)(auVar4._10_3_ >> 0x10) + (uint)(uint3)(auVar3._10_3_ >> 0x10) +
                 auVar6._4_4_ + (int)CONCAT72(SUB137(auVar10 << 0x40,6),(ushort)(byte)(uVar1 >> 8))
                 + auVar5._8_4_ + (int)uVar8 + (int)uVar7 + (uVar1 & 0xff) + 4 >> 3 & 0xff) *
         0x101010101010101;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0x100);
  return;
}

Assistant:

static void DC8uvNoLeft_C(uint8_t* dst) {   // DC with no left samples
  int dc0 = 4;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[i - BPS];
  }
  Put8x8uv(dc0 >> 3, dst);
}